

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O3

void __thiscall
QHttpThreadDelegate::dataReadProgressSlot(QHttpThreadDelegate *this,qint64 done,qint64 total)

{
  long in_FS_OFFSET;
  qint64 local_38;
  qint64 local_30;
  void *local_28;
  qint64 *local_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(this + 0x120) != 0) {
    LOCK();
    **(int **)(this + 0x58) = **(int **)(this + 0x58) + 1;
    UNLOCK();
    local_20 = &local_30;
    local_28 = (void *)0x0;
    local_38 = total;
    local_30 = done;
    local_18 = (undefined1 *)&local_38;
    QMetaObject::activate((QObject *)this,&staticMetaObject,9,&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpThreadDelegate::dataReadProgressSlot(qint64 done, qint64 total)
{
    // If we don't have a download buffer don't attempt to go this codepath
    // It is not used by QNetworkAccessHttpBackend
    if (downloadBuffer.isNull())
        return;

    pendingDownloadProgress->fetchAndAddRelease(1);
    emit downloadProgress(done, total);
}